

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_registry.cc
# Opt level: O2

void __thiscall
test_registry_minimal_keeps_alias_persistent_flag::test_method
          (test_registry_minimal_keeps_alias_persistent_flag *this)

{
  allocator local_271;
  string local_270 [8];
  undefined8 local_268;
  shared_count asStack_260 [2];
  char *local_250;
  char *local_248;
  undefined **local_240;
  undefined1 local_238;
  undefined8 *local_230;
  char **local_228;
  char *local_220;
  char *local_218;
  RegistryIterator it;
  char *local_208;
  Registry target;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  Registry registry;
  
  Typelib::Registry::Registry(&registry);
  Typelib::CXX::addStandardTypes(&registry);
  Typelib::Registry::Registry(&target);
  Typelib::CXX::addStandardTypes(&target);
  std::__cxx11::string::string((string *)&local_240,"/int",(allocator *)&local_250);
  std::__cxx11::string::string(local_270,"/Persistent",(allocator *)&local_220);
  std::__cxx11::string::string((string *)&it,"",&local_271);
  Typelib::Registry::alias((string *)&target,(string *)&local_240,SUB81(local_270,0),(string *)0x1);
  std::__cxx11::string::~string((string *)&it);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::string((string *)&local_240,"/int",(allocator *)&local_250);
  std::__cxx11::string::string(local_270,"/Temporary",(allocator *)&local_220);
  std::__cxx11::string::string((string *)&it,"",&local_271);
  Typelib::Registry::alias((string *)&target,(string *)&local_240,SUB81(local_270,0),(string *)0x0);
  std::__cxx11::string::~string((string *)&it);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string((string *)&local_240);
  Typelib::Registry::minimal(&target,SUB81(&registry,0));
  std::__cxx11::string::string((string *)&local_240,"/Persistent",(allocator *)local_270);
  Typelib::Registry::find((string *)&it);
  std::__cxx11::string::~string((string *)&local_240);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x10d);
  Typelib::Registry::end();
  local_270[0] = (string)(local_248 != local_208);
  local_268 = 0;
  asStack_260[0].pi_ = (sp_counted_base *)0x0;
  local_220 = "it != target.end()";
  local_218 = "";
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00179318;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = &local_220;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_d8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_260);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x10e);
  local_270[0] = *(string *)(local_208 + 0x48);
  local_268 = 0;
  asStack_260[0].pi_ = (sp_counted_base *)0x0;
  local_250 = "it.isPersistent()";
  local_248 = "";
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00179318;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_108 = "";
  local_228 = &local_250;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_260);
  std::__cxx11::string::string((string *)&local_240,"/Temporary",(allocator *)local_270);
  Typelib::Registry::find((string *)&it);
  std::__cxx11::string::~string((string *)&local_240);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x112);
  Typelib::Registry::end();
  local_270[0] = (string)(local_248 != local_208);
  local_268 = 0;
  asStack_260[0].pi_ = (sp_counted_base *)0x0;
  local_220 = "it != target.end()";
  local_218 = "";
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00179318;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = &local_220;
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_138 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_260);
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_148 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x113);
  local_270[0] = (string)(local_208[0x48] ^ 1);
  local_268 = 0;
  asStack_260[0].pi_ = (sp_counted_base *)0x0;
  local_250 = "!it.isPersistent()";
  local_248 = "";
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00179318;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = &local_250;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_260);
  Typelib::Registry::~Registry(&target);
  Typelib::Registry::~Registry(&registry);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( test_registry_minimal_keeps_alias_persistent_flag )
{
    Registry registry;
    Typelib::CXX::addStandardTypes(registry);
    Registry target;
    Typelib::CXX::addStandardTypes(target);
    target.alias("/int", "/Persistent", true);
    target.alias("/int", "/Temporary", false);

    target.minimal(registry);
    { RegistryIterator it = target.find("/Persistent");
        BOOST_REQUIRE(it != target.end());
        BOOST_REQUIRE(it.isPersistent());
    }

    { RegistryIterator it = target.find("/Temporary");
        BOOST_REQUIRE(it != target.end());
        BOOST_REQUIRE(!it.isPersistent());
    }
}